

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-netcdf-cursor.c
# Opt level: O0

int coda_netcdf_cursor_goto_attributes(coda_cursor *cursor)

{
  coda_dynamic_type_struct *pcVar1;
  coda_dynamic_type *pcVar2;
  coda_netcdf_type *type;
  coda_cursor *cursor_local;
  
  pcVar1 = cursor->stack[cursor->n + -1].type;
  cursor->n = cursor->n + 1;
  if (*(long *)(pcVar1 + 1) == 0) {
    pcVar2 = coda_mem_empty_record(coda_format_netcdf);
    cursor->stack[cursor->n + -1].type = pcVar2;
  }
  else {
    cursor->stack[cursor->n + -1].type = *(coda_dynamic_type_struct **)(pcVar1 + 1);
  }
  cursor->stack[cursor->n + -1].index = -1;
  cursor->stack[cursor->n + -1].bit_offset = -1;
  return 0;
}

Assistant:

int coda_netcdf_cursor_goto_attributes(coda_cursor *cursor)
{
    coda_netcdf_type *type;

    type = (coda_netcdf_type *)cursor->stack[cursor->n - 1].type;
    cursor->n++;
    if (type->attributes != NULL)
    {
        cursor->stack[cursor->n - 1].type = (coda_dynamic_type *)type->attributes;
    }
    else
    {
        cursor->stack[cursor->n - 1].type = coda_mem_empty_record(coda_format_netcdf);
    }
    /* we use the special index value '-1' to indicate that we are pointing to the attributes of the parent */
    cursor->stack[cursor->n - 1].index = -1;
    cursor->stack[cursor->n - 1].bit_offset = -1;       /* not applicable for netCDF backend */

    return 0;
}